

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void rec_varg(jit_State *J,BCReg dst,ptrdiff_t nresults)

{
  TValue *pTVar1;
  IRRef1 IVar2;
  uint uVar3;
  TRef TVar4;
  TRef TVar5;
  int iVar6;
  int32_t iVar7;
  long lVar8;
  long lVar9;
  long in_RDX;
  uint in_ESI;
  jit_State *in_RDI;
  TRef vbase_1;
  TRef aref_1;
  IRType t_1;
  TRef tmp2;
  TRef tmp_1;
  TRef tmp;
  ptrdiff_t idx;
  TRef tr_1;
  TRef tridx;
  TRef tr;
  TRef aref;
  IRType t;
  TRef vbase;
  ptrdiff_t nload;
  ptrdiff_t i_1;
  int32_t frofs;
  TRef fr;
  ptrdiff_t i;
  ptrdiff_t nvararg;
  int32_t numparams;
  TraceError in_stack_fffffffffffffd2c;
  jit_State *in_stack_fffffffffffffd30;
  jit_State *pjVar10;
  undefined4 in_stack_fffffffffffffd38;
  undefined2 in_stack_fffffffffffffd3c;
  undefined2 in_stack_fffffffffffffd3e;
  jit_State *in_stack_fffffffffffffd40;
  uint32_t in_stack_fffffffffffffd4c;
  undefined6 in_stack_fffffffffffffd58;
  undefined2 in_stack_fffffffffffffd5e;
  undefined8 in_stack_fffffffffffffd60;
  undefined6 in_stack_fffffffffffffd68;
  undefined2 in_stack_fffffffffffffd6e;
  IRRef1 IVar11;
  TRef local_208;
  TRef local_204;
  IRRef1 local_1f0;
  TRef local_1e0;
  uint local_1dc;
  TRef local_1d8;
  long local_1c0;
  long local_1b0;
  long local_1a8;
  long local_198;
  uint local_14;
  uint local_4;
  
  TVar5 = (TRef)((ulong)in_stack_fffffffffffffd60 >> 0x20);
  uVar3 = (uint)in_RDI->pt->numparams;
  local_1a8 = (long)(int)(((*(int *)((long)in_RDI->L->base + -4) >> 3) - uVar3) + -1);
  iVar6 = (int)in_RDX;
  if (in_RDI->framedepth < 1) {
    (in_RDI->fold).ins.field_0.ot = 0x4513;
    (in_RDI->fold).ins.field_0.op1 = 0;
    (in_RDI->fold).ins.field_0.op2 = 0x12;
    TVar4 = lj_opt_fold((jit_State *)
                        CONCAT26(in_stack_fffffffffffffd3e,
                                 CONCAT24(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38)));
    IVar2 = (IRRef1)TVar4;
    if (in_RDX < 0) {
      iVar6 = select_detect(in_RDI);
      if (iVar6 != 0) {
        local_1dc = in_RDI->base[in_ESI - 1];
        local_1e0 = 0x7fff;
        iVar7 = lj_ffrecord_select_mode
                          ((jit_State *)
                           CONCAT26(in_stack_fffffffffffffd6e,in_stack_fffffffffffffd68),TVar5,
                           (TValue *)CONCAT26(in_stack_fffffffffffffd5e,in_stack_fffffffffffffd58));
        lVar8 = (long)iVar7;
        if (-1 < lVar8) {
          if ((lVar8 != 0) && (4 < (local_1dc >> 0x18 & 0x1f) - 0xf)) {
            (in_RDI->fold).ins.field_0.ot = 0x5593;
            (in_RDI->fold).ins.field_0.op1 = (IRRef1)local_1dc;
            (in_RDI->fold).ins.field_0.op2 = 0x226e;
            local_1dc = lj_opt_fold((jit_State *)
                                    CONCAT26(in_stack_fffffffffffffd3e,
                                             CONCAT24(in_stack_fffffffffffffd3c,
                                                      in_stack_fffffffffffffd38)));
          }
          if ((lVar8 == 0) || (0x7fff < (local_1dc & 0xffff))) {
            if (local_1a8 < lVar8) {
              TVar5 = lj_ir_kint(in_stack_fffffffffffffd40,
                                 CONCAT22(in_stack_fffffffffffffd3e,in_stack_fffffffffffffd3c));
              local_1f0 = (IRRef1)TVar5;
              if (lVar8 == 0) {
                local_1e0 = lj_ir_kint(in_stack_fffffffffffffd40,
                                       CONCAT22(in_stack_fffffffffffffd3e,in_stack_fffffffffffffd3c)
                                      );
              }
              else {
                in_stack_fffffffffffffd40 = in_RDI;
                IVar11 = (IRRef1)local_1dc;
                TVar5 = lj_ir_kint(in_RDI,CONCAT22(in_stack_fffffffffffffd3e,
                                                   in_stack_fffffffffffffd3c));
                (in_stack_fffffffffffffd40->fold).ins.field_0.ot = 0x2313;
                (in_stack_fffffffffffffd40->fold).ins.field_0.op1 = IVar11;
                (in_stack_fffffffffffffd40->fold).ins.field_0.op2 = (IRRef1)TVar5;
                TVar5 = lj_opt_fold((jit_State *)
                                    CONCAT26(in_stack_fffffffffffffd3e,
                                             CONCAT24(in_stack_fffffffffffffd3c,
                                                      in_stack_fffffffffffffd38)));
                (in_RDI->fold).ins.field_0.ot = 0x2813;
                (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar5;
                (in_RDI->fold).ins.field_0.op2 = local_1f0;
                TVar5 = lj_opt_fold((jit_State *)
                                    CONCAT26(in_stack_fffffffffffffd3e,
                                             CONCAT24(in_stack_fffffffffffffd3c,
                                                      in_stack_fffffffffffffd38)));
                local_1f0 = (IRRef1)TVar5;
              }
              (in_RDI->fold).ins.field_0.ot = 0x93;
              (in_RDI->fold).ins.field_0.op1 = IVar2;
              (in_RDI->fold).ins.field_0.op2 = local_1f0;
              lj_opt_fold((jit_State *)
                          CONCAT26(in_stack_fffffffffffffd3e,
                                   CONCAT24(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38)));
            }
            else {
              TVar5 = lj_ir_kint(in_stack_fffffffffffffd40,
                                 CONCAT22(in_stack_fffffffffffffd3e,in_stack_fffffffffffffd3c));
              (in_RDI->fold).ins.field_0.ot = 0x2813;
              (in_RDI->fold).ins.field_0.op1 = IVar2;
              (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar5;
              TVar5 = lj_opt_fold((jit_State *)
                                  CONCAT26(in_stack_fffffffffffffd3e,
                                           CONCAT24(in_stack_fffffffffffffd3c,
                                                    in_stack_fffffffffffffd38)));
              IVar11 = (IRRef1)TVar5;
              if (uVar3 != 0) {
                TVar5 = lj_ir_kint(in_stack_fffffffffffffd40,
                                   CONCAT22(in_stack_fffffffffffffd3e,in_stack_fffffffffffffd3c));
                (in_RDI->fold).ins.field_0.ot = 0x193;
                (in_RDI->fold).ins.field_0.op1 = IVar11;
                (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar5;
                lj_opt_fold((jit_State *)
                            CONCAT26(in_stack_fffffffffffffd3e,
                                     CONCAT24(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38)))
                ;
              }
              pjVar10 = in_RDI;
              TVar5 = lj_ir_kint(in_stack_fffffffffffffd40,
                                 CONCAT22(in_stack_fffffffffffffd3e,in_stack_fffffffffffffd3c));
              (pjVar10->fold).ins.field_0.ot = 0x2413;
              (pjVar10->fold).ins.field_0.op1 = IVar11;
              (pjVar10->fold).ins.field_0.op2 = (IRRef1)TVar5;
              local_1e0 = lj_opt_fold((jit_State *)
                                      CONCAT26(in_stack_fffffffffffffd3e,
                                               CONCAT24(in_stack_fffffffffffffd3c,
                                                        in_stack_fffffffffffffd38)));
              if (lVar8 != 0) {
                pjVar10 = in_RDI;
                TVar5 = lj_ir_kint(in_stack_fffffffffffffd40,
                                   CONCAT22(in_stack_fffffffffffffd3e,in_stack_fffffffffffffd3c));
                (pjVar10->fold).ins.field_0.ot = 0x2813;
                (pjVar10->fold).ins.field_0.op1 = (IRRef1)local_1dc;
                (pjVar10->fold).ins.field_0.op2 = (IRRef1)TVar5;
                TVar5 = lj_opt_fold((jit_State *)
                                    CONCAT26(in_stack_fffffffffffffd3e,
                                             CONCAT24(in_stack_fffffffffffffd3c,
                                                      in_stack_fffffffffffffd38)));
                rec_idx_abc((jit_State *)CONCAT26((IRRef1)local_1dc,in_stack_fffffffffffffd58),
                            (TRef)((ulong)pjVar10 >> 0x20),(TRef)pjVar10,in_stack_fffffffffffffd4c);
                local_1dc._0_2_ = (IRRef1)TVar5;
              }
            }
          }
          else {
            TVar5 = lj_ir_kint(in_stack_fffffffffffffd40,
                               CONCAT22(in_stack_fffffffffffffd3e,in_stack_fffffffffffffd3c));
            (in_RDI->fold).ins.field_0.ot = (ushort)(lVar8 <= local_1a8) << 8 | 0x93;
            (in_RDI->fold).ins.field_0.op1 = IVar2;
            (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar5;
            lj_opt_fold((jit_State *)
                        CONCAT26(in_stack_fffffffffffffd3e,
                                 CONCAT24(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38)));
          }
          if ((lVar8 != 0) && (lVar8 <= local_1a8)) {
            (in_RDI->fold).ins.field_0.ot = 0x2913;
            (in_RDI->fold).ins.field_0.op1 = 0x8000;
            (in_RDI->fold).ins.field_0.op2 = IVar2;
            TVar5 = lj_opt_fold((jit_State *)
                                CONCAT26(in_stack_fffffffffffffd3e,
                                         CONCAT24(in_stack_fffffffffffffd3c,
                                                  in_stack_fffffffffffffd38)));
            IVar2 = (IRRef1)TVar5;
            pjVar10 = in_RDI;
            TVar5 = lj_ir_kint(in_stack_fffffffffffffd40,CONCAT22(IVar2,in_stack_fffffffffffffd3c));
            (pjVar10->fold).ins.field_0.ot = 0x2805;
            (pjVar10->fold).ins.field_0.op1 = IVar2;
            (pjVar10->fold).ins.field_0.op2 = (IRRef1)TVar5;
            TVar5 = lj_opt_fold((jit_State *)
                                CONCAT26(IVar2,CONCAT24(in_stack_fffffffffffffd3c,
                                                        in_stack_fffffffffffffd38)));
            pTVar1 = in_RDI->L->base;
            local_1a8 = (lVar8 + -2) - local_1a8;
            if ((&pTVar1->field_2)[local_1a8].it < 0xfffeffff) {
              local_14 = 0xe;
            }
            else if ((int)(&pTVar1->field_2)[local_1a8].it >> 0xf == -2) {
              local_14 = 3;
            }
            else {
              local_14 = (&pTVar1->field_2)[local_1a8].it ^ 0xffffffff;
            }
            (in_RDI->fold).ins.field_0.ot = 0x3805;
            (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar5;
            (in_RDI->fold).ins.field_0.op2 = (IRRef1)local_1dc;
            TVar5 = lj_opt_fold((jit_State *)
                                CONCAT26(IVar2,CONCAT24(in_stack_fffffffffffffd3c,
                                                        in_stack_fffffffffffffd38)));
            (in_RDI->fold).ins.field_0.ot = (ushort)local_14 | 0x4680;
            (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar5;
            (in_RDI->fold).ins.field_0.op2 = 0;
            local_1e0 = lj_opt_fold((jit_State *)
                                    CONCAT26(IVar2,CONCAT24(in_stack_fffffffffffffd3c,
                                                            in_stack_fffffffffffffd38)));
            if (local_14 < 3) {
              local_1e0 = local_14 * 0xffffff + 0x7fff;
            }
          }
          in_RDI->base[in_ESI - 2] = local_1e0;
          in_RDI->maxslot = in_ESI - 1;
          in_RDI->bcskip = '\x02';
          return;
        }
      }
      (in_RDI->errinfo).u64 = 0x4050c00000000000;
      lj_trace_err_info(in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c);
    }
    if (local_1a8 < 1) {
      TVar5 = lj_ir_kint(in_stack_fffffffffffffd40,
                         CONCAT22(in_stack_fffffffffffffd3e,in_stack_fffffffffffffd3c));
      (in_RDI->fold).ins.field_0.ot = 0x293;
      (in_RDI->fold).ins.field_0.op1 = IVar2;
      (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar5;
      lj_opt_fold((jit_State *)
                  CONCAT26(in_stack_fffffffffffffd3e,
                           CONCAT24(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38)));
      local_1a8 = 0;
    }
    else {
      if (local_1a8 < in_RDX) {
        TVar5 = lj_ir_kint(in_stack_fffffffffffffd40,
                           CONCAT22(in_stack_fffffffffffffd3e,in_stack_fffffffffffffd3c));
        (in_RDI->fold).ins.field_0.ot = 0x893;
        (in_RDI->fold).ins.field_0.op1 = IVar2;
        (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar5;
        lj_opt_fold((jit_State *)
                    CONCAT26(in_stack_fffffffffffffd3e,
                             CONCAT24(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38)));
        lVar8 = local_1a8;
      }
      else {
        TVar5 = lj_ir_kint(in_stack_fffffffffffffd40,
                           CONCAT22(in_stack_fffffffffffffd3e,in_stack_fffffffffffffd3c));
        (in_RDI->fold).ins.field_0.ot = 0x193;
        (in_RDI->fold).ins.field_0.op1 = IVar2;
        (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar5;
        lj_opt_fold((jit_State *)
                    CONCAT26(in_stack_fffffffffffffd3e,
                             CONCAT24(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38)));
        lVar8 = in_RDX;
      }
      (in_RDI->fold).ins.field_0.ot = 0x2913;
      (in_RDI->fold).ins.field_0.op1 = 0x8000;
      (in_RDI->fold).ins.field_0.op2 = IVar2;
      TVar5 = lj_opt_fold((jit_State *)
                          CONCAT26(in_stack_fffffffffffffd3e,
                                   CONCAT24(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38)));
      TVar4 = lj_ir_kint(in_stack_fffffffffffffd40,
                         CONCAT22(in_stack_fffffffffffffd3e,in_stack_fffffffffffffd3c));
      (in_RDI->fold).ins.field_0.ot = 0x2805;
      (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar5;
      (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar4;
      TVar5 = lj_opt_fold((jit_State *)
                          CONCAT26(in_stack_fffffffffffffd3e,
                                   CONCAT24(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38)));
      for (local_1c0 = 0; local_1c0 < lVar8; local_1c0 = local_1c0 + 1) {
        pTVar1 = in_RDI->L->base;
        lVar9 = (local_1c0 + -1) - local_1a8;
        if ((&pTVar1->field_2)[lVar9].it < 0xfffeffff) {
          local_4 = 0xe;
        }
        else if ((int)(&pTVar1->field_2)[lVar9].it >> 0xf == -2) {
          local_4 = 3;
        }
        else {
          local_4 = (&pTVar1->field_2)[lVar9].it ^ 0xffffffff;
        }
        TVar4 = lj_ir_kint(in_stack_fffffffffffffd40,
                           CONCAT22(in_stack_fffffffffffffd3e,in_stack_fffffffffffffd3c));
        (in_RDI->fold).ins.field_0.ot = 0x3805;
        (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar5;
        (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar4;
        TVar4 = lj_opt_fold((jit_State *)
                            CONCAT26(in_stack_fffffffffffffd3e,
                                     CONCAT24(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38)))
        ;
        (in_RDI->fold).ins.field_0.ot = (ushort)local_4 | 0x4680;
        (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar4;
        (in_RDI->fold).ins.field_0.op2 = 0;
        local_1d8 = lj_opt_fold((jit_State *)
                                CONCAT26(in_stack_fffffffffffffd3e,
                                         CONCAT24(in_stack_fffffffffffffd3c,
                                                  in_stack_fffffffffffffd38)));
        if (local_4 < 3) {
          local_1d8 = local_4 * 0xffffff + 0x7fff;
        }
        in_RDI->base[(ulong)in_ESI + local_1c0] = local_1d8;
      }
    }
    for (local_1c0 = local_1a8; local_1c0 < in_RDX; local_1c0 = local_1c0 + 1) {
      in_RDI->base[(ulong)in_ESI + local_1c0] = 0x7fff;
    }
    if (in_RDI->maxslot < in_ESI + iVar6) {
      in_RDI->maxslot = in_ESI + iVar6;
    }
  }
  else {
    if (local_1a8 < 0) {
      local_1a8 = 0;
    }
    if (in_RDX == -1) {
      local_198 = local_1a8;
      in_RDI->maxslot = in_ESI + (int)local_1a8;
    }
    else {
      local_198 = in_RDX;
      if ((long)(ulong)in_RDI->maxslot < (long)((ulong)in_ESI + in_RDX)) {
        in_RDI->maxslot = in_ESI + iVar6;
      }
    }
    for (local_1b0 = 0; local_1b0 < local_198; local_1b0 = local_1b0 + 1) {
      if (local_1b0 < local_1a8) {
        if (in_RDI->base[(local_1b0 - local_1a8) + -1] == 0) {
          local_204 = sload(in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c);
        }
        else {
          local_204 = in_RDI->base[(local_1b0 - local_1a8) + -1];
        }
        local_208 = local_204;
      }
      else {
        local_208 = 0x7fff;
      }
      in_RDI->base[(ulong)in_ESI + local_1b0] = local_208;
    }
  }
  return;
}

Assistant:

static void rec_varg(jit_State *J, BCReg dst, ptrdiff_t nresults)
{
  int32_t numparams = J->pt->numparams;
  ptrdiff_t nvararg = frame_delta(J->L->base-1) - numparams - 1;
  lua_assert(frame_isvarg(J->L->base-1));
  if (J->framedepth > 0) {  /* Simple case: varargs defined on-trace. */
    ptrdiff_t i;
    if (nvararg < 0) nvararg = 0;
    if (nresults == -1) {
      nresults = nvararg;
      J->maxslot = dst + (BCReg)nvararg;
    } else if (dst + nresults > J->maxslot) {
      J->maxslot = dst + (BCReg)nresults;
    }
    for (i = 0; i < nresults; i++)
      J->base[dst+i] = i < nvararg ? getslot(J, i - nvararg - 1) : TREF_NIL;
  } else {  /* Unknown number of varargs passed to trace. */
    TRef fr = emitir(IRTI(IR_SLOAD), 0, IRSLOAD_READONLY|IRSLOAD_FRAME);
    int32_t frofs = 8*(1+numparams)+FRAME_VARG;
    if (nresults >= 0) {  /* Known fixed number of results. */
      ptrdiff_t i;
      if (nvararg > 0) {
	ptrdiff_t nload = nvararg >= nresults ? nresults : nvararg;
	TRef vbase;
	if (nvararg >= nresults)
	  emitir(IRTGI(IR_GE), fr, lj_ir_kint(J, frofs+8*(int32_t)nresults));
	else
	  emitir(IRTGI(IR_EQ), fr, lj_ir_kint(J, frame_ftsz(J->L->base-1)));
	vbase = emitir(IRTI(IR_SUB), REF_BASE, fr);
	vbase = emitir(IRT(IR_ADD, IRT_P32), vbase, lj_ir_kint(J, frofs-8));
	for (i = 0; i < nload; i++) {
	  IRType t = itype2irt(&J->L->base[i-1-nvararg]);
	  TRef aref = emitir(IRT(IR_AREF, IRT_P32),
			     vbase, lj_ir_kint(J, (int32_t)i));
	  TRef tr = emitir(IRTG(IR_VLOAD, t), aref, 0);
	  if (irtype_ispri(t)) tr = TREF_PRI(t);  /* Canonicalize primitives. */
	  J->base[dst+i] = tr;
	}
      } else {
	emitir(IRTGI(IR_LE), fr, lj_ir_kint(J, frofs));
	nvararg = 0;
      }
      for (i = nvararg; i < nresults; i++)
	J->base[dst+i] = TREF_NIL;
      if (dst + (BCReg)nresults > J->maxslot)
	J->maxslot = dst + (BCReg)nresults;
    } else if (select_detect(J)) {  /* y = select(x, ...) */
      TRef tridx = J->base[dst-1];
      TRef tr = TREF_NIL;
      ptrdiff_t idx = lj_ffrecord_select_mode(J, tridx, &J->L->base[dst-1]);
      if (idx < 0) goto nyivarg;
      if (idx != 0 && !tref_isinteger(tridx))
	tridx = emitir(IRTGI(IR_CONV), tridx, IRCONV_INT_NUM|IRCONV_INDEX);
      if (idx != 0 && tref_isk(tridx)) {
	emitir(IRTGI(idx <= nvararg ? IR_GE : IR_LT),
	       fr, lj_ir_kint(J, frofs+8*(int32_t)idx));
	frofs -= 8;  /* Bias for 1-based index. */
      } else if (idx <= nvararg) {  /* Compute size. */
	TRef tmp = emitir(IRTI(IR_ADD), fr, lj_ir_kint(J, -frofs));
	if (numparams)
	  emitir(IRTGI(IR_GE), tmp, lj_ir_kint(J, 0));
	tr = emitir(IRTI(IR_BSHR), tmp, lj_ir_kint(J, 3));
	if (idx != 0) {
	  tridx = emitir(IRTI(IR_ADD), tridx, lj_ir_kint(J, -1));
	  rec_idx_abc(J, tr, tridx, (uint32_t)nvararg);
	}
      } else {
	TRef tmp = lj_ir_kint(J, frofs);
	if (idx != 0) {
	  TRef tmp2 = emitir(IRTI(IR_BSHL), tridx, lj_ir_kint(J, 3));
	  tmp = emitir(IRTI(IR_ADD), tmp2, tmp);
	} else {
	  tr = lj_ir_kint(J, 0);
	}
	emitir(IRTGI(IR_LT), fr, tmp);
      }
      if (idx != 0 && idx <= nvararg) {
	IRType t;
	TRef aref, vbase = emitir(IRTI(IR_SUB), REF_BASE, fr);
	vbase = emitir(IRT(IR_ADD, IRT_P32), vbase, lj_ir_kint(J, frofs-8));
	t = itype2irt(&J->L->base[idx-2-nvararg]);
	aref = emitir(IRT(IR_AREF, IRT_P32), vbase, tridx);
	tr = emitir(IRTG(IR_VLOAD, t), aref, 0);
	if (irtype_ispri(t)) tr = TREF_PRI(t);  /* Canonicalize primitives. */
      }
      J->base[dst-2] = tr;
      J->maxslot = dst-1;
      J->bcskip = 2;  /* Skip CALLM + select. */
    } else {
    nyivarg:
      setintV(&J->errinfo, BC_VARG);
      lj_trace_err_info(J, LJ_TRERR_NYIBC);
    }
  }
}